

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O3

Rational * soplex::LPFreadInfinity(Rational *__return_storage_ptr__,char **pos)

{
  long lVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double *pdVar8;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *prVar9;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *extraout_RAX_00;
  int iVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  byte bVar14;
  char *pcVar15;
  data_type local_78;
  undefined4 local_68;
  undefined2 local_64;
  char local_62;
  ulong local_58;
  void *local_50;
  undefined4 local_48;
  undefined2 local_44;
  char local_42;
  
  local_78.la[0] = (ulong)(**pos != '-') * 2 - 1;
  iVar10 = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (&__return_storage_ptr__->m_backend,(longlong *)local_78.la,(type *)0x0);
  pcVar11 = *pos + 1;
  *pos = pcVar11;
  iVar12 = 0;
  do {
    lVar7 = (long)iVar10;
    cVar2 = "inf[inity]"[lVar7];
    if (cVar2 == '[') {
      pcVar4 = "inf[inity]" + (iVar10 + 1);
      lVar13 = 0;
      iVar5 = iVar10;
      do {
        iVar10 = iVar5;
        pcVar15 = pcVar4;
        cVar2 = pcVar11[lVar13 + iVar12];
        iVar6 = tolower((int)cVar2);
        lVar1 = lVar13 + 1;
        if (cVar2 == '\0') break;
        lVar3 = lVar13 + lVar7 + 1;
        pcVar4 = pcVar15 + 1;
        lVar13 = lVar1;
        iVar5 = iVar10 + 1;
      } while (iVar6 == "inf[inity]"[lVar3]);
      do {
        iVar10 = iVar10 + 1;
        cVar2 = *pcVar15;
        pcVar15 = pcVar15 + 1;
      } while (cVar2 != ']');
      iVar12 = iVar12 + (int)lVar1 + -2;
    }
    else {
      if (cVar2 == '\0') {
        bVar14 = pcVar11[iVar12];
        goto LAB_001777ad;
      }
      bVar14 = pcVar11[iVar12];
      iVar5 = tolower((int)(char)bVar14);
      if (iVar5 != cVar2) {
        if (cVar2 == '\0') {
LAB_001777ad:
          if (((bVar14 < 0x21) && ((0x100002601U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) ||
             ((byte)(bVar14 - 0x3c) < 3)) {
            *pos = pcVar11 + iVar12;
          }
        }
        ::soplex::infinity::__tls_init();
        pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
        local_78.la[0] = 0;
        local_68 = 1;
        local_64 = 0x100;
        local_62 = '\0';
        local_58 = 1;
        local_48 = 1;
        local_44 = 0x100;
        local_42 = '\0';
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                     *)&local_78.ld,(longdouble)*pdVar8);
        prVar9 = boost::
                 rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)__return_storage_ptr__,
                              (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&local_78.ld);
        if ((local_44._1_1_ == '\0') && (local_42 == '\0')) {
          operator_delete(local_50,(local_58 & 0xffffffff) << 3);
          prVar9 = extraout_RAX;
        }
        if ((local_64._1_1_ == '\0') && (local_62 == '\0')) {
          operator_delete(local_78.ld.data,(local_78.la[0] & 0xffffffff) << 3);
          prVar9 = extraout_RAX_00;
        }
        return (Rational *)prVar9;
      }
    }
    iVar10 = iVar10 + 1;
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

static Rational LPFreadInfinity(char*& pos)
{
   assert(LPFisInfinity(pos));

   Rational sense = (*pos == '-') ? -1 : 1;

   (void) LPFhasKeyword(++pos, "inf[inity]");

   sense *= Rational(infinity);
   return sense;
}